

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

void __thiscall
AI::HierarchicalTaskNetworkComponent::initializeComponent(HierarchicalTaskNetworkComponent *this)

{
  bool bVar1;
  World *this_00;
  GameMode *this_01;
  TaskDatabase *this_02;
  char *__s;
  size_type sVar2;
  mapped_type_conflict *pmVar3;
  mapped_type *pmVar4;
  map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
  *pmVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>,_bool>
  pVar6;
  ValueOverTimeTracker local_1b8;
  WorldStateIdentifier local_184;
  key_type local_180;
  anon_class_1_0_00000001 local_179;
  _Base_ptr local_178;
  undefined1 local_170;
  ValueOverTimeTracker local_168;
  WorldStateIdentifier local_134;
  key_type local_130;
  anon_class_1_0_00000001 local_129;
  _Base_ptr local_128;
  undefined1 local_120;
  ValueOverTimeTracker local_118;
  WorldStateIdentifier local_e4;
  key_type local_e0;
  undefined1 local_db;
  allocator<float> local_da;
  allocator<char> local_d9;
  value_type local_d8;
  int local_9c;
  undefined1 local_96;
  allocator<float> local_95;
  int j;
  allocator<char> local_81;
  value_type local_80;
  reference local_48;
  pair<const_AI::TaskIdentifier,_std::vector<AI::Consideration,_std::allocator<AI::Consideration>_>_>
  *kvp;
  iterator __end1;
  iterator __begin1;
  map<AI::TaskIdentifier,_std::vector<AI::Consideration,_std::allocator<AI::Consideration>_>,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_std::vector<AI::Consideration,_std::allocator<AI::Consideration>_>_>_>_>
  *__range1;
  TaskDatabase *tasks;
  GameMode *gameMode;
  World *world;
  HierarchicalTaskNetworkComponent *this_local;
  
  this_00 = Component::getWorld(&this->super_Component);
  this_01 = World::getAuthGameMode(this_00);
  GameMode::registerForFixedTicks(this_01,&this->super_IFixedTickable);
  WorldQuerier::setup(&this->worldQuerySystem,this_00,(this->super_Component).owner);
  this_02 = GameMode::getAvailableTasks(this_01);
  __end1 = std::
           map<AI::TaskIdentifier,_std::vector<AI::Consideration,_std::allocator<AI::Consideration>_>,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_std::vector<AI::Consideration,_std::allocator<AI::Consideration>_>_>_>_>
           ::begin(&this_02->considerations);
  kvp = (pair<const_AI::TaskIdentifier,_std::vector<AI::Consideration,_std::allocator<AI::Consideration>_>_>
         *)std::
           map<AI::TaskIdentifier,_std::vector<AI::Consideration,_std::allocator<AI::Consideration>_>,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_std::vector<AI::Consideration,_std::allocator<AI::Consideration>_>_>_>_>
           ::end(&this_02->considerations);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&kvp), bVar1) {
    local_48 = std::
               _Rb_tree_iterator<std::pair<const_AI::TaskIdentifier,_std::vector<AI::Consideration,_std::allocator<AI::Consideration>_>_>_>
               ::operator*(&__end1);
    std::
    map<AI::TaskIdentifier,_AI::Task,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_AI::Task>_>_>
    ::operator[](&this_02->tasks,&local_48->first);
    __s = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_81);
    local_96 = 1;
    std::allocator<float>::allocator(&local_95);
    std::vector<float,_std::allocator<float>_>::vector(&local_80.scores,5,&local_95);
    local_96 = 0;
    std::vector<AI::FUtilityScores,_std::allocator<AI::FUtilityScores>_>::push_back
              (&this->utilityScores,&local_80);
    FUtilityScores::~FUtilityScores(&local_80);
    std::allocator<float>::~allocator(&local_95);
    std::allocator<char>::~allocator(&local_81);
    std::
    _Rb_tree_iterator<std::pair<const_AI::TaskIdentifier,_std::vector<AI::Consideration,_std::allocator<AI::Consideration>_>_>_>
    ::operator++(&__end1);
  }
  sVar2 = std::
          map<AI::TaskIdentifier,_std::vector<AI::Consideration,_std::allocator<AI::Consideration>_>,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_std::vector<AI::Consideration,_std::allocator<AI::Consideration>_>_>_>_>
          ::size(&this_02->considerations);
  if (sVar2 < 5) {
    sVar2 = std::
            map<AI::TaskIdentifier,_std::vector<AI::Consideration,_std::allocator<AI::Consideration>_>,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_std::vector<AI::Consideration,_std::allocator<AI::Consideration>_>_>_>_>
            ::size(&this_02->considerations);
    for (local_9c = (int)sVar2; local_9c < 5; local_9c = local_9c + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_d9);
      local_db = 1;
      std::allocator<float>::allocator(&local_da);
      std::vector<float,_std::allocator<float>_>::vector(&local_d8.scores,5,&local_da);
      local_db = 0;
      std::vector<AI::FUtilityScores,_std::allocator<AI::FUtilityScores>_>::push_back
                (&this->utilityScores,&local_d8);
      FUtilityScores::~FUtilityScores(&local_d8);
      std::allocator<float>::~allocator(&local_da);
      std::allocator<char>::~allocator(&local_d9);
    }
  }
  local_e0 = Stance;
  pmVar3 = std::
           map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
           ::operator[](&(this->state).current.values,&local_e0);
  *pmVar3 = 0.0;
  local_e4 = Alertness;
  ValueOverTimeTracker::ValueOverTimeTracker(&local_118);
  pVar6 = std::
          map<WorldStateIdentifier,ValueOverTimeTracker,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
          ::emplace<WorldStateIdentifier,ValueOverTimeTracker>
                    ((map<WorldStateIdentifier,ValueOverTimeTracker,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
                      *)&(this->state).valueTrackers,&local_e4,&local_118);
  local_128 = (_Base_ptr)pVar6.first._M_node;
  local_120 = pVar6.second;
  ValueOverTimeTracker::~ValueOverTimeTracker(&local_118);
  pmVar5 = &(this->state).valueTrackers;
  local_130 = Alertness;
  pmVar4 = std::
           map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
           ::operator[](pmVar5,&local_130);
  std::function<bool(ValueOverTimeTracker&)>::operator=
            ((function<bool(ValueOverTimeTracker&)> *)&pmVar4->durationExceedsExtension,&local_129);
  local_134 = Curiosity;
  ValueOverTimeTracker::ValueOverTimeTracker(&local_168);
  pVar6 = std::
          map<WorldStateIdentifier,ValueOverTimeTracker,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
          ::emplace<WorldStateIdentifier,ValueOverTimeTracker>
                    ((map<WorldStateIdentifier,ValueOverTimeTracker,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
                      *)pmVar5,&local_134,&local_168);
  local_178 = (_Base_ptr)pVar6.first._M_node;
  local_170 = pVar6.second;
  ValueOverTimeTracker::~ValueOverTimeTracker(&local_168);
  pmVar5 = &(this->state).valueTrackers;
  local_180 = Curiosity;
  pmVar4 = std::
           map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
           ::operator[](pmVar5,&local_180);
  std::function<bool(ValueOverTimeTracker&)>::operator=
            ((function<bool(ValueOverTimeTracker&)> *)&pmVar4->durationExceedsExtension,&local_179);
  local_184 = PlayerIdentified;
  ValueOverTimeTracker::ValueOverTimeTracker(&local_1b8);
  std::
  map<WorldStateIdentifier,ValueOverTimeTracker,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
  ::emplace<WorldStateIdentifier,ValueOverTimeTracker>
            ((map<WorldStateIdentifier,ValueOverTimeTracker,std::less<WorldStateIdentifier>,std::allocator<std::pair<WorldStateIdentifier_const,ValueOverTimeTracker>>>
              *)pmVar5,&local_184,&local_1b8);
  ValueOverTimeTracker::~ValueOverTimeTracker(&local_1b8);
  Barker::operator=(&(this->state).barker,&this->barker);
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::initializeComponent()
{
	auto world = getWorld();
	auto gameMode = world->getAuthGameMode();
	gameMode->registerForFixedTicks(this);
	
	worldQuerySystem.setup(world, owner);

	auto& tasks = gameMode->getAvailableTasks();

	for (auto& kvp : tasks.considerations)
	{
		utilityScores.push_back({tasks.tasks[kvp.first].debugName.c_str(), std::vector<float>(5)});
	}

	if (tasks.considerations.size() < 5)
	{
		for (int j = tasks.considerations.size(); j < 5; j++)
		{
			utilityScores.push_back({"", std::vector<float>(5)});
		}
	}

	state.current.values[WorldStateIdentifier::Stance] = static_cast<float>(Stance::Standing);
	
	state.valueTrackers.emplace(WorldStateIdentifier::Alertness, ValueOverTimeTracker{});
	state.valueTrackers[WorldStateIdentifier::Alertness].durationExceedsExtension =
		[](auto& tracker) {return tracker.durationBelowValue > (tracker.maxValue / 8.f);};

	state.valueTrackers.emplace(WorldStateIdentifier::Curiosity, ValueOverTimeTracker{});
	state.valueTrackers[WorldStateIdentifier::Curiosity].durationExceedsExtension =
		[](auto& tracker) {return tracker.durationBelowValue > (tracker.maxValue / 8.f);};

	state.valueTrackers.emplace(WorldStateIdentifier::PlayerIdentified, ValueOverTimeTracker{});

	state.barker = barker;
}